

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testNNCompilerValidationBadProbBlob(void)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  StringFeatureType *pSVar9;
  DictionaryFeatureType *pDVar10;
  TypeUnion TVar11;
  StringVector *this;
  Type *pTVar12;
  InnerProductLayerParams *pIVar13;
  ostream *poVar14;
  Result res;
  Model m1;
  string probsName;
  string featureName;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Model local_a0;
  string local_70;
  string local_50;
  
  CoreML::Specification::Model::Model(&local_a0);
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_a0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  iVar2 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar2 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar2] = 1;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  ((pFVar7->Type_).multiarraytype_)->datatype_ = 0x10020;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_a0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"middle","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  iVar2 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar2 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar2] = 1;
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  ((pFVar7->Type_).multiarraytype_)->datatype_ = 0x10020;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_a0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 3;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pFVar7->Type_).stringtype_ = pSVar9;
  }
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_a0.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 6;
    pDVar10 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar10);
    (pFVar7->Type_).dictionarytype_ = pDVar10;
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 6;
    pDVar10 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar10);
    (pFVar7->Type_).dictionarytype_ = pDVar10;
  }
  pDVar10 = (pFVar7->Type_).dictionarytype_;
  if (pDVar10->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar10);
    pDVar10->_oneof_case_[0] = 2;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pDVar10->KeyType_).stringkeytype_ = pSVar9;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"features","");
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_a0.description_ = pMVar5;
  }
  psVar3 = ((local_a0.description_)->predictedfeaturename_).ptr_;
  if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_a0.description_)->predictedfeaturename_,&local_50);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"probs","");
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_a0.description_ = pMVar5;
  }
  psVar3 = ((local_a0.description_)->predictedprobabilitiesname_).ptr_;
  if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_a0.description_)->predictedprobabilitiesname_,&local_70);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  if (local_a0._oneof_case_[0] != 0x193) {
    CoreML::Specification::Model::clear_Type(&local_a0);
    local_a0._oneof_case_[0] = 0x193;
    TVar11.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x68);
    CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier
              (TVar11.neuralnetworkclassifier_);
    local_a0.Type_.pipelineclassifier_ = TVar11.pipelineclassifier_;
  }
  TVar11 = local_a0.Type_;
  if (*(uint32 *)((long)&(local_a0.Type_.supportvectorclassifier_)->proba_ + 0xc) != 100) {
    CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels
              (local_a0.Type_.neuralnetworkclassifier_);
    *(uint32 *)((long)&(TVar11.supportvectorclassifier_)->proba_ + 0xc) = 100;
    this = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(this);
    ((ClassLabelsUnion *)&(TVar11.itemsimilarityrecommender_)->itemstringids_)->stringclasslabels_ =
         this;
  }
  CoreML::Specification::StringVector::add_vector
            (((ClassLabelsUnion *)&(TVar11.itemsimilarityrecommender_)->itemstringids_)->
             stringclasslabels_,"label1");
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"not_here","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(TVar11.bayesianprobitregressor_)->samplingtruncationinputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar11.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar12,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar12,"middle");
  if (pTVar12->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar12);
    pTVar12->_oneof_case_[0] = 0x8c;
    pIVar13 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar13);
    (pTVar12->layer_).innerproduct_ = pIVar13;
  }
  *(undefined1 *)&(((pTVar12->layer_).convolution_)->stride_).rep_ = 0;
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar11.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar12,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar12,"output");
  if (pTVar12->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar12);
    pTVar12->_oneof_case_[0] = 0x8c;
    pIVar13 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar13);
    (pTVar12->layer_).innerproduct_ = pIVar13;
  }
  *(undefined1 *)&(((pTVar12->layer_).convolution_)->stride_).rep_ = 0;
  CoreML::validate<(MLModelType)403>((Result *)local_c8,&local_a0);
  bVar4 = CoreML::Result::good((Result *)local_c8);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x456);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._8_8_ != &local_b0) {
    operator_delete((void *)local_c8._8_8_,local_b0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_a0);
  return (uint)bVar4;
}

Assistant:

int testNNCompilerValidationBadProbBlob() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("middle");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *out2 = m1.mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    m1.mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    m1.mutable_description()->set_predictedprobabilitiesname(probsName);


    const auto nn = m1.mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");
    nn->set_labelprobabilitylayername("not_here");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetworkClassifier>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}